

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

RedactionState
google::protobuf::TextFormat::IsOptionSensitive
          (Message *opts,Reflection *reflection,FieldDescriptor *option)

{
  pointer ppFVar1;
  pointer ppFVar2;
  bool bVar3;
  int iVar4;
  int number;
  EnumDescriptor *this;
  EnumValueDescriptor *pEVar5;
  Message *this_00;
  pointer ppFVar6;
  RedactionState unaff_R12W;
  int iVar7;
  Metadata MVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message_fields;
  
  if ((ulong)option->type_ == 0xe) {
    bVar3 = FieldDescriptor::is_repeated(option);
    if (bVar3) {
      iVar4 = Reflection::FieldSize(reflection,opts,option);
    }
    else {
      iVar4 = 1;
    }
    iVar7 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar7;
    }
    do {
      if (iVar4 == iVar7) goto LAB_0021f6bf;
      bVar3 = FieldDescriptor::is_repeated(option);
      if (bVar3) {
        number = Reflection::GetRepeatedEnumValue(reflection,opts,option,iVar7);
      }
      else {
        number = Reflection::GetEnumValue(reflection,opts,option);
      }
      this = FieldDescriptor::enum_type(option);
      pEVar5 = EnumDescriptor::FindValueByNumber(this,number);
      iVar7 = iVar7 + 1;
    } while ((pEVar5->options_->field_0)._impl_.debug_redact_ == false);
    unaff_R12W.redact = true;
    unaff_R12W.report = false;
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option->type_ * 4) == 10) {
    bVar3 = FieldDescriptor::is_repeated(option);
    if (bVar3) {
      iVar4 = Reflection::FieldSize(reflection,opts,option);
    }
    else {
      iVar4 = 1;
    }
    iVar7 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar7;
    }
    do {
      if (iVar7 == iVar4) goto LAB_0021f6bf;
      bVar3 = FieldDescriptor::is_repeated(option);
      if (bVar3) {
        this_00 = Reflection::GetRepeatedMessage(reflection,opts,option,iVar7);
      }
      else {
        this_00 = Reflection::GetMessage(reflection,opts,option,(MessageFactory *)0x0);
      }
      MVar8 = Message::GetMetadata(this_00);
      message_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      message_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      message_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Reflection::ListFields(MVar8.reflection,this_00,&message_fields);
      ppFVar1 = message_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppFVar2 = message_fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ppFVar6 = ppFVar2;
        if (ppFVar6 == ppFVar1) break;
        unaff_R12W = IsOptionSensitive(this_00,MVar8.reflection,*ppFVar6);
        ppFVar2 = ppFVar6 + 1;
      } while (((ushort)unaff_R12W & 1) == 0);
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&message_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      iVar7 = iVar7 + 1;
    } while (ppFVar6 == ppFVar1);
  }
  else {
LAB_0021f6bf:
    unaff_R12W.redact = false;
    unaff_R12W.report = false;
  }
  return (RedactionState)((ushort)unaff_R12W & 0xff);
}

Assistant:

TextFormat::RedactionState TextFormat::IsOptionSensitive(
    const Message& opts, const Reflection* reflection,
    const FieldDescriptor* option) {
  if (option->type() == FieldDescriptor::TYPE_ENUM) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      int enum_val = option->is_repeated()
                         ? reflection->GetRepeatedEnumValue(opts, option, i)
                         : reflection->GetEnumValue(opts, option);
      const EnumValueDescriptor* option_value =
          option->enum_type()->FindValueByNumber(enum_val);
      if (option_value->options().debug_redact()) {
        return TextFormat::RedactionState{true, false};
      }
    }
  } else if (option->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    auto count =
        option->is_repeated() ? reflection->FieldSize(opts, option) : 1;
    for (auto i = 0; i < count; i++) {
      const Message& sub_message =
          option->is_repeated()
              ? reflection->GetRepeatedMessage(opts, option, i)
              : reflection->GetMessage(opts, option);
      const Reflection* sub_reflection = sub_message.GetReflection();
      std::vector<const FieldDescriptor*> message_fields;
      sub_reflection->ListFields(sub_message, &message_fields);
      for (const FieldDescriptor* message_field : message_fields) {
        auto result = TextFormat::IsOptionSensitive(sub_message, sub_reflection,
                                                    message_field);
        if (result.redact) {
          return result;
        }
      }
    }
  }
  return TextFormat::RedactionState{false, false};
}